

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O0

QSize __thiscall QSize::scaled(QSize *this,QSize *s,AspectRatioMode mode)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int in_EDX;
  QSize *in_RSI;
  long in_FS_OFFSET;
  qint64 rw;
  bool useHeight;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QSize *in_stack_ffffffffffffff70;
  undefined1 local_39;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_39 = true;
  if (in_EDX != 0) {
    bVar2 = QtPrivate::QCheckedIntegers::operator==<int,_true>
                      (&in_stack_ffffffffffffff70->wd,
                       (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_39 = true;
    if (!bVar2) {
      local_39 = QtPrivate::QCheckedIntegers::operator==<int,_true>
                           (&in_stack_ffffffffffffff70->wd,
                            (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  if (local_39 == false) {
    iVar3 = height((QSize *)0x6359ae);
    iVar4 = width((QSize *)0x6359bf);
    iVar5 = height((QSize *)0x6359dc);
    lVar6 = ((long)iVar3 * (long)iVar4) / (long)iVar5;
    if (in_EDX == 1) {
      iVar3 = width((QSize *)0x635a0b);
      bVar2 = lVar6 <= iVar3;
    }
    else {
      iVar3 = width((QSize *)0x635a37);
      bVar2 = iVar3 <= lVar6;
    }
    if (bVar2) {
      height((QSize *)0x635a67);
      QSize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
    else {
      width((QSize *)0x635a86);
      width((QSize *)0x635a94);
      height((QSize *)0x635aa5);
      width((QSize *)0x635ac2);
      QSize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
  }
  else {
    local_10 = *in_RSI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QSize::scaled(const QSize &s, Qt::AspectRatioMode mode) const noexcept
{
    if (mode == Qt::IgnoreAspectRatio || wd == 0 || ht == 0) {
        return s;
    } else {
        bool useHeight;
        qint64 rw = qint64(s.height()) * qint64(width()) / qint64(height());

        if (mode == Qt::KeepAspectRatio) {
            useHeight = (rw <= s.width());
        } else { // mode == Qt::KeepAspectRatioByExpanding
            useHeight = (rw >= s.width());
        }

        if (useHeight) {
            return QSize(int(rw), s.height());
        } else {
            return QSize(s.width(),
                         qint32(qint64(s.width()) * qint64(height()) / qint64(width())));
        }
    }
}